

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls_scache.c
# Opt level: O2

CURLcode Curl_ssl_scache_take
                   (Curl_cfilter *cf,Curl_easy *data,char *ssl_peer_key,Curl_ssl_session **ps)

{
  uint uVar1;
  curl_trc_feat *pcVar2;
  char *pcVar3;
  size_t sVar4;
  Curl_ssl_scache_peer *peer_00;
  CURLcode CVar5;
  Curl_ssl_scache *scache;
  ssl_primary_config *conn_config;
  time_t now;
  Curl_llist_node *e;
  Curl_ssl_session *pCVar6;
  long lVar7;
  size_t sVar8;
  char *pcVar9;
  Curl_ssl_scache_peer *peer;
  
  scache = cf_ssl_scache_get(data);
  conn_config = Curl_ssl_cf_get_primary_config(cf);
  peer = (Curl_ssl_scache_peer *)0x0;
  *ps = (Curl_ssl_session *)0x0;
  if (scache == (Curl_ssl_scache *)0x0) {
    CVar5 = CURLE_OK;
  }
  else {
    Curl_ssl_scache_lock(data);
    CVar5 = cf_ssl_find_peer_by_key(data,scache,ssl_peer_key,conn_config,&peer);
    peer_00 = peer;
    pCVar6 = (Curl_ssl_session *)0x0;
    if (peer != (Curl_ssl_scache_peer *)0x0 && CVar5 == CURLE_OK) {
      now = time((time_t *)0x0);
      cf_scache_peer_remove_expired(peer_00,now);
      e = Curl_llist_head(&peer_00->sessions);
      if (e != (Curl_llist_node *)0x0) {
        pCVar6 = (Curl_ssl_session *)Curl_node_take_elem(e);
        lVar7 = scache->age + 1;
        scache->age = lVar7;
        peer_00->age = lVar7;
      }
    }
    Curl_ssl_scache_unlock(data);
    if (pCVar6 == (Curl_ssl_session *)0x0) {
      if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
          ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))
          ) && (0 < Curl_trc_feat_ssls.log_level)) {
        Curl_trc_ssls(data,"no cached session for %s",ssl_peer_key);
      }
    }
    else {
      *ps = pCVar6;
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
         (((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))
          && (0 < Curl_trc_feat_ssls.log_level)))) {
        uVar1 = pCVar6->ietf_tls_id;
        pcVar3 = pCVar6->alpn;
        sVar4 = pCVar6->earlydata_max;
        pcVar9 = "yes";
        if (pCVar6->quic_tp == (uchar *)0x0) {
          pcVar9 = "no";
        }
        sVar8 = Curl_llist_count(&peer_00->sessions);
        Curl_trc_ssls(data,
                      "took session for %s [proto=0x%x, alpn=%s, earlydata=%zu, quic_tp=%s], %zu sessions remain"
                      ,ssl_peer_key,(ulong)uVar1,pcVar3,sVar4,pcVar9,sVar8);
      }
    }
  }
  return CVar5;
}

Assistant:

CURLcode Curl_ssl_scache_take(struct Curl_cfilter *cf,
                              struct Curl_easy *data,
                              const char *ssl_peer_key,
                              struct Curl_ssl_session **ps)
{
  struct Curl_ssl_scache *scache = cf_ssl_scache_get(data);
  struct ssl_primary_config *conn_config = Curl_ssl_cf_get_primary_config(cf);
  struct Curl_ssl_scache_peer *peer = NULL;
  struct Curl_llist_node *n;
  struct Curl_ssl_session *s = NULL;
  CURLcode result;

  *ps = NULL;
  if(!scache)
    return CURLE_OK;

  Curl_ssl_scache_lock(data);
  result = cf_ssl_find_peer_by_key(data, scache, ssl_peer_key, conn_config,
                                   &peer);
  if(!result && peer) {
    cf_scache_peer_remove_expired(peer, (curl_off_t)time(NULL));
    n = Curl_llist_head(&peer->sessions);
    if(n) {
      s = Curl_node_take_elem(n);
      (scache->age)++;            /* increase general age */
      peer->age = scache->age; /* set this as used in this age */
    }
  }
  Curl_ssl_scache_unlock(data);
  if(s) {
    *ps = s;
    CURL_TRC_SSLS(data, "took session for %s [proto=0x%x, "
                  "alpn=%s, earlydata=%zu, quic_tp=%s], %zu sessions remain",
                  ssl_peer_key, s->ietf_tls_id, s->alpn,
                  s->earlydata_max, s->quic_tp ? "yes" : "no",
                  Curl_llist_count(&peer->sessions));
  }
  else {
    CURL_TRC_SSLS(data, "no cached session for %s", ssl_peer_key);
  }
  return result;
}